

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Fail_TestShell::createTest
          (TEST_TeamCityOutputTest_TestNameEscaped_Fail_TestShell *this)

{
  TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test *this_00;
  
  this_00 = (TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0xd5);
  TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test::
  TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Fail)
{
	tst->setTestName("'[]\n\r");
	TestFailure fail(tst, "failfile", 20, "failure message");
	tcout->printFailure(fail);
	const char* expected =
		"##teamcity[testFailed name='|'|[|]|n|r' message='TEST failed (file:10): failfile:20' "
		"details='failure message']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}